

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardrtn.c
# Opt level: O0

void incusecount68k(FX *fx68k)

{
  ushort uVar1;
  DLword DVar2;
  uint *puVar3;
  DLword *local_18;
  StackWord *scanptr68k;
  FX *fx68k_local;
  
  if ((fx68k != (FX *)0x0) && (fx68k != (FX *)Stackspace)) {
    uVar1 = (*(ushort *)&fx68k->field_0x2 & 0xff) + 1 & 0xff;
    *(ushort *)&fx68k->field_0x2 = *(ushort *)&fx68k->field_0x2 & 0xff00 | uVar1;
    if (200 < uVar1) {
      error("MP9324:Stack frame use count maximum exceeded");
    }
    local_18 = NativeAligned2FromStackOffset(fx68k->nextblock);
    uVar1 = *(ushort *)((ulong)local_18 ^ 2) >> 0xd;
    if (uVar1 == 0) {
      for (; *(ushort *)((ulong)local_18 ^ 2) >> 0xd != 4; local_18 = local_18 + 2) {
      }
    }
    else if (uVar1 != 4) {
      return;
    }
    puVar3 = (uint *)(local_18 + 2);
    if ((*(ushort *)((ulong)puVar3 ^ 2) >> 0xd == 6) && ((*puVar3 & 1) == 0)) {
      DVar2 = StackOffsetFromNative(local_18);
      local_18[0xb] = DVar2;
      local_18[10] = (DLword)*puVar3;
      *puVar3 = *puVar3 & 0xfffffffe | 1;
    }
  }
  return;
}

Assistant:

void incusecount68k(FX *fx68k) {
  StackWord *scanptr68k;

  if (FX_INVALIDP(fx68k)) return;

  CHECK_FX(fx68k);

  if ((++(fx68k->usecount)) > MAXSAFEUSECOUNT)
    error("MP9324:Stack frame use count maximum exceeded");

  scanptr68k = (StackWord *)NativeAligned2FromStackOffset(fx68k->nextblock);
  switch (STKWORD(scanptr68k)->flags) {
    case STK_NOTFLG:
      while (STKWORD(scanptr68k)->flags != STK_BF)
        scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);
      break;

    case STK_BF: break;

    default:
      return;
      /* break; */
  } /* switch end */

  /* DEBUG */
  S_CHECK(
      (((Bframe *)scanptr68k)->residual == T) || (((Bframe *)scanptr68k)->ivar == fx68k->nextblock),
      "BF not residual, and IVER /= nextblock of prior frame");

  scanptr68k = (StackWord *)(((DLword *)scanptr68k) + DLWORDSPER_CELL);

  if (STKWORD(scanptr68k)->flags == STK_FX) {
    CHECK_FX((FX *)scanptr68k);
    SET_FASTP_NIL(scanptr68k);
  }

}